

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadFields(CrateReader *this)

{
  value_type vVar1;
  long lVar2;
  StreamReader *this_00;
  void *pvVar3;
  ulong uVar4;
  bool bVar5;
  size_type sVar6;
  ostream *poVar7;
  uint *out;
  reference pvVar8;
  void *pvVar9;
  char *pcVar10;
  void *pvVar11;
  ulong maxOutputSize;
  unsigned_long *outputPtr;
  size_t sVar12;
  reference pvVar13;
  reference pvVar14;
  undefined1 local_1380 [8];
  optional<tinyusdz::Token> tokv;
  size_t i_2;
  size_type local_1348;
  size_t i_1;
  ostringstream local_1320 [8];
  ostringstream ss_e_10;
  undefined1 local_11a8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> reps_data;
  ostringstream local_1170 [8];
  ostringstream ss_e_9;
  size_t uncompressed_size;
  ostringstream local_fd0 [8];
  ostringstream ss_e_8;
  allocator_type local_e51;
  undefined1 local_e50 [8];
  vector<char,_std::allocator<char>_> comp_buffer;
  ostringstream local_e18 [8];
  ostringstream ss_e_7;
  string local_ca0;
  ostringstream local_c80 [8];
  ostringstream ss_e_6;
  string local_b08;
  ostringstream local_ae8 [8];
  ostringstream ss_e_5;
  string local_970;
  ostringstream local_950 [8];
  ostringstream ss_e_4;
  void *local_7d8;
  uint64_t reps_size;
  size_t i;
  string local_7c0;
  ostringstream local_7a0 [8];
  ostringstream ss_e_3;
  undefined1 local_628 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  ostringstream local_5f0 [8];
  ostringstream ss_e_2;
  string local_478;
  ostringstream local_458 [8];
  ostringstream ss_e_1;
  string local_2e0;
  ostringstream local_2c0 [8];
  ostringstream ss_e;
  ulong local_148;
  uint64_t num_fields;
  Section *s;
  string local_118;
  string local_f8;
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  CrateReader *local_18;
  CrateReader *this_local;
  
  local_18 = this;
  if ((this->_fields_index < 0) ||
     (lVar2 = this->_fields_index,
     sVar6 = ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
             size(&(this->_toc).sections), (long)sVar6 <= lVar2)) {
    ::std::__cxx11::string::operator+=
              ((string *)&this->_err,"Invalid index for `FIELDS` section.\n");
    this_local._7_1_ = 0;
  }
  else if ((this->_version[0] == '\0') && (this->_version[1] < 4)) {
    ::std::__cxx11::to_string(&local_f8,(uint)this->_version[0]);
    ::std::operator+((char *)local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Version must be 0.4.0 or later, but got ");
    ::std::operator+(local_b8,(char *)local_d8);
    ::std::__cxx11::to_string(&local_118,(uint)this->_version[1]);
    ::std::operator+(local_98,local_b8);
    ::std::operator+(local_78,(char *)local_98);
    ::std::__cxx11::to_string((string *)&s,(uint)this->_version[2]);
    ::std::operator+(local_58,local_78);
    ::std::operator+(local_38,(char *)local_58);
    ::std::__cxx11::string::operator+=((string *)&this->_err,(string *)local_38);
    ::std::__cxx11::string::~string((string *)local_38);
    ::std::__cxx11::string::~string((string *)local_58);
    ::std::__cxx11::string::~string((string *)&s);
    ::std::__cxx11::string::~string((string *)local_78);
    ::std::__cxx11::string::~string((string *)local_98);
    ::std::__cxx11::string::~string((string *)&local_118);
    ::std::__cxx11::string::~string((string *)local_b8);
    ::std::__cxx11::string::~string(local_d8);
    ::std::__cxx11::string::~string((string *)&local_f8);
    this_local._7_1_ = 0;
  }
  else {
    num_fields = (uint64_t)
                 ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
                 ::operator[](&(this->_toc).sections,this->_fields_index);
    if (((reference)num_fields)->size == 0) {
      this_local._7_1_ = 1;
    }
    else {
      bVar5 = StreamReader::seek_set(this->_sr,((reference)num_fields)->start);
      if (bVar5) {
        bVar5 = StreamReader::read8(this->_sr,&local_148);
        if (bVar5) {
          if (local_148 == 0) {
            this_local._7_1_ = 1;
          }
          else if ((this->_config).maxNumFields < local_148) {
            ::std::__cxx11::ostringstream::ostringstream(local_2c0);
            poVar7 = ::std::operator<<((ostream *)local_2c0,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,"[Crate]");
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReadFields");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x163f);
            ::std::operator<<(poVar7," ");
            poVar7 = ::std::operator<<((ostream *)local_2c0,"Too many fields in `FIELDS` section.");
            ::std::operator<<(poVar7,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_2e0);
            ::std::__cxx11::string::~string((string *)&local_2e0);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_2c0);
          }
          else {
            this->_memoryUsage = local_148 * 0x10 + this->_memoryUsage;
            if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
              ::std::__cxx11::ostringstream::ostringstream(local_458);
              poVar7 = ::std::operator<<((ostream *)local_458,"[error]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,"[Crate]");
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReadFields");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1649);
              ::std::operator<<(poVar7," ");
              poVar7 = ::std::operator<<((ostream *)local_458,"Reached to max memory budget.");
              ::std::operator<<(poVar7,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_478);
              ::std::__cxx11::string::~string((string *)&local_478);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_458);
            }
            else {
              ::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::resize
                        (&this->_fields,local_148);
              this->_memoryUsage = local_148 * 4 + this->_memoryUsage;
              if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                ::std::__cxx11::ostringstream::ostringstream(local_5f0);
                poVar7 = ::std::operator<<((ostream *)local_5f0,"[error]");
                poVar7 = ::std::operator<<(poVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar7 = ::std::operator<<(poVar7,"[Crate]");
                poVar7 = ::std::operator<<(poVar7,":");
                poVar7 = ::std::operator<<(poVar7,"ReadFields");
                poVar7 = ::std::operator<<(poVar7,"():");
                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1650);
                ::std::operator<<(poVar7," ");
                poVar7 = ::std::operator<<((ostream *)local_5f0,"Reached to max memory budget.");
                ::std::operator<<(poVar7,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)
                               &tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
                ::std::__cxx11::string::~string
                          ((string *)
                           &tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_5f0);
              }
              else {
                ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_628);
                ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_628,
                           local_148);
                out = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_628);
                bVar5 = ReadCompressedInts<unsigned_int>(this,out,local_148);
                if (bVar5) {
                  for (reps_size = 0; reps_size < local_148; reps_size = reps_size + 1) {
                    pvVar8 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        local_628,reps_size);
                    vVar1 = *pvVar8;
                    pvVar14 = ::std::
                              vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
                              ::operator[](&this->_fields,reps_size);
                    (pvVar14->token_index).super_Index.value = vVar1;
                  }
                  if (this->_memoryUsage < local_148 << 2) {
                    this->_memoryUsage = this->_memoryUsage + local_148 * -4;
                  }
                  i._4_4_ = 0;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_7a0);
                  poVar7 = ::std::operator<<((ostream *)local_7a0,"[error]");
                  poVar7 = ::std::operator<<(poVar7,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar7 = ::std::operator<<(poVar7,"[Crate]");
                  poVar7 = ::std::operator<<(poVar7,":");
                  poVar7 = ::std::operator<<(poVar7,"ReadFields");
                  poVar7 = ::std::operator<<(poVar7,"():");
                  poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1655);
                  ::std::operator<<(poVar7," ");
                  poVar7 = ::std::operator<<((ostream *)local_7a0,
                                             "Failed to read Field token_index array.");
                  ::std::operator<<(poVar7,"\n");
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,&local_7c0);
                  ::std::__cxx11::string::~string((string *)&local_7c0);
                  this_local._7_1_ = 0;
                  i._4_4_ = 1;
                  ::std::__cxx11::ostringstream::~ostringstream(local_7a0);
                }
                ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_628);
                if (i._4_4_ == 0) {
                  bVar5 = StreamReader::read8(this->_sr,(uint64_t *)&local_7d8);
                  pvVar3 = local_7d8;
                  if (bVar5) {
                    if (*(void **)(num_fields + 0x18) < local_7d8) {
                      ::std::__cxx11::ostringstream::ostringstream(local_ae8);
                      poVar7 = ::std::operator<<((ostream *)local_ae8,"[error]");
                      poVar7 = ::std::operator<<(poVar7,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                );
                      poVar7 = ::std::operator<<(poVar7,"[Crate]");
                      poVar7 = ::std::operator<<(poVar7,":");
                      poVar7 = ::std::operator<<(poVar7,"ReadFields");
                      poVar7 = ::std::operator<<(poVar7,"():");
                      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1668);
                      ::std::operator<<(poVar7," ");
                      poVar7 = ::std::operator<<((ostream *)local_ae8,
                                                 "Invalid byte size of Value reps data.");
                      ::std::operator<<(poVar7,"\n");
                      ::std::__cxx11::ostringstream::str();
                      PushError(this,&local_b08);
                      ::std::__cxx11::string::~string((string *)&local_b08);
                      this_local._7_1_ = 0;
                      i._4_4_ = 1;
                      ::std::__cxx11::ostringstream::~ostringstream(local_ae8);
                    }
                    else {
                      pvVar9 = (void *)StreamReader::size(this->_sr);
                      pvVar11 = local_7d8;
                      if (pvVar9 < pvVar3) {
                        ::std::__cxx11::ostringstream::ostringstream(local_c80);
                        poVar7 = ::std::operator<<((ostream *)local_c80,"[error]");
                        poVar7 = ::std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                        poVar7 = ::std::operator<<(poVar7,"[Crate]");
                        poVar7 = ::std::operator<<(poVar7,":");
                        poVar7 = ::std::operator<<(poVar7,"ReadFields");
                        poVar7 = ::std::operator<<(poVar7,"():");
                        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x166c);
                        ::std::operator<<(poVar7," ");
                        poVar7 = ::std::operator<<((ostream *)local_c80,
                                                   "Compressed Value reps size exceeds USDC data.");
                        ::std::operator<<(poVar7,"\n");
                        ::std::__cxx11::ostringstream::str();
                        PushError(this,&local_ca0);
                        ::std::__cxx11::string::~string((string *)&local_ca0);
                        this_local._7_1_ = 0;
                        i._4_4_ = 1;
                        ::std::__cxx11::ostringstream::~ostringstream(local_c80);
                      }
                      else {
                        this->_memoryUsage = (long)local_7d8 + this->_memoryUsage;
                        if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                          ::std::__cxx11::ostringstream::ostringstream(local_e18);
                          poVar7 = ::std::operator<<((ostream *)local_e18,"[error]");
                          poVar7 = ::std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                          poVar7 = ::std::operator<<(poVar7,"[Crate]");
                          poVar7 = ::std::operator<<(poVar7,":");
                          poVar7 = ::std::operator<<(poVar7,"ReadFields");
                          poVar7 = ::std::operator<<(poVar7,"():");
                          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x166f);
                          ::std::operator<<(poVar7," ");
                          poVar7 = ::std::operator<<((ostream *)local_e18,
                                                     "Reached to max memory budget.");
                          ::std::operator<<(poVar7,"\n");
                          ::std::__cxx11::ostringstream::str();
                          PushError(this,(string *)
                                         &comp_buffer.
                                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                          field_0x10);
                          ::std::__cxx11::string::~string
                                    ((string *)
                                     &comp_buffer.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.field_0x10);
                          this_local._7_1_ = 0;
                          i._4_4_ = 1;
                          ::std::__cxx11::ostringstream::~ostringstream(local_e18);
                        }
                        else {
                          ::std::allocator<char>::allocator();
                          std::vector<char,_std::allocator<char>_>::vector
                                    ((vector<char,_std::allocator<char>_> *)local_e50,
                                     (size_type)pvVar11,&local_e51);
                          ::std::allocator<char>::~allocator((allocator<char> *)&local_e51);
                          pvVar3 = local_7d8;
                          this_00 = this->_sr;
                          pcVar10 = std::vector<char,_std::allocator<char>_>::data
                                              ((vector<char,_std::allocator<char>_> *)local_e50);
                          pvVar11 = (void *)StreamReader::read(this_00,(int)pvVar3,pvVar3,
                                                               (size_t)pcVar10);
                          uVar4 = local_148;
                          if (pvVar3 == pvVar11) {
                            maxOutputSize = local_148 * 8;
                            this->_memoryUsage = maxOutputSize + this->_memoryUsage;
                            if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                              ::std::__cxx11::ostringstream::ostringstream(local_1170);
                              poVar7 = ::std::operator<<((ostream *)local_1170,"[error]");
                              poVar7 = ::std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                              poVar7 = ::std::operator<<(poVar7,"[Crate]");
                              poVar7 = ::std::operator<<(poVar7,":");
                              poVar7 = ::std::operator<<(poVar7,"ReadFields");
                              poVar7 = ::std::operator<<(poVar7,"():");
                              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x167c);
                              ::std::operator<<(poVar7," ");
                              poVar7 = ::std::operator<<((ostream *)local_1170,
                                                         "Reached to max memory budget.");
                              ::std::operator<<(poVar7,"\n");
                              ::std::__cxx11::ostringstream::str();
                              PushError(this,(string *)
                                             &reps_data.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                              ::std::__cxx11::string::~string
                                        ((string *)
                                         &reps_data.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                              this_local._7_1_ = 0;
                              i._4_4_ = 1;
                              ::std::__cxx11::ostringstream::~ostringstream(local_1170);
                            }
                            else {
                              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         local_11a8);
                              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         local_11a8,local_148);
                              pcVar10 = std::vector<char,_std::allocator<char>_>::data
                                                  ((vector<char,_std::allocator<char>_> *)local_e50)
                              ;
                              outputPtr = ::std::
                                          vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                          data((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                *)local_11a8);
                              sVar12 = LZ4Compression::DecompressFromBuffer
                                                 (pcVar10,(char *)outputPtr,(size_t)local_7d8,
                                                  maxOutputSize,&this->_err);
                              if (maxOutputSize == sVar12) {
                                for (local_1348 = 0; local_1348 < local_148;
                                    local_1348 = local_1348 + 1) {
                                  pvVar13 = ::std::
                                            vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                            operator[]((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)local_11a8,local_1348);
                                  ValueRep::ValueRep((ValueRep *)&i_2,*pvVar13);
                                  pvVar14 = ::std::
                                            vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
                                            ::operator[](&this->_fields,local_1348);
                                  (pvVar14->value_rep).data = i_2;
                                }
                                if (this->_memoryUsage < maxOutputSize) {
                                  this->_memoryUsage = this->_memoryUsage + uVar4 * -8;
                                }
                                if ((void *)this->_memoryUsage < local_7d8) {
                                  this->_memoryUsage = this->_memoryUsage - (long)local_7d8;
                                }
                                i._4_4_ = 0;
                              }
                              else {
                                ::std::__cxx11::ostringstream::ostringstream(local_1320);
                                poVar7 = ::std::operator<<((ostream *)local_1320,"[error]");
                                poVar7 = ::std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                poVar7 = ::std::operator<<(poVar7,"[Crate]");
                                poVar7 = ::std::operator<<(poVar7,":");
                                poVar7 = ::std::operator<<(poVar7,"ReadFields");
                                poVar7 = ::std::operator<<(poVar7,"():");
                                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1686);
                                ::std::operator<<(poVar7," ");
                                poVar7 = ::std::operator<<((ostream *)local_1320,
                                                           "Failed to read Fields ValueRep data.");
                                ::std::operator<<(poVar7,"\n");
                                ::std::__cxx11::ostringstream::str();
                                PushError(this,(string *)&i_1);
                                ::std::__cxx11::string::~string((string *)&i_1);
                                this_local._7_1_ = 0;
                                i._4_4_ = 1;
                                ::std::__cxx11::ostringstream::~ostringstream(local_1320);
                              }
                              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         local_11a8);
                            }
                          }
                          else {
                            ::std::__cxx11::ostringstream::ostringstream(local_fd0);
                            poVar7 = ::std::operator<<((ostream *)local_fd0,"[error]");
                            poVar7 = ::std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                            poVar7 = ::std::operator<<(poVar7,"[Crate]");
                            poVar7 = ::std::operator<<(poVar7,":");
                            poVar7 = ::std::operator<<(poVar7,"ReadFields");
                            poVar7 = ::std::operator<<(poVar7,"():");
                            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1677);
                            ::std::operator<<(poVar7," ");
                            poVar7 = ::std::operator<<((ostream *)local_fd0,
                                                                                                              
                                                  "Failed to read reps data at `FIELDS` section.");
                            ::std::operator<<(poVar7,"\n");
                            ::std::__cxx11::ostringstream::str();
                            PushError(this,(string *)&uncompressed_size);
                            ::std::__cxx11::string::~string((string *)&uncompressed_size);
                            this_local._7_1_ = 0;
                            i._4_4_ = 1;
                            ::std::__cxx11::ostringstream::~ostringstream(local_fd0);
                          }
                          std::vector<char,_std::allocator<char>_>::~vector
                                    ((vector<char,_std::allocator<char>_> *)local_e50);
                          if (i._4_4_ == 0) {
                            for (tokv.contained._24_8_ = 0; (ulong)tokv.contained._24_8_ < local_148
                                ; tokv.contained._24_8_ = tokv.contained._24_8_ + 1) {
                              pvVar14 = ::std::
                                        vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
                                        ::operator[](&this->_fields,tokv.contained._24_8_);
                              GetToken((optional<tinyusdz::Token> *)local_1380,this,
                                       (Index)(pvVar14->token_index).super_Index.value);
                              nonstd::optional_lite::optional::operator_cast_to_bool
                                        ((optional *)local_1380);
                              nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                                        ((optional<tinyusdz::Token> *)local_1380);
                            }
                            this_local._7_1_ = 1;
                          }
                        }
                      }
                    }
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_950);
                    poVar7 = ::std::operator<<((ostream *)local_950,"[error]");
                    poVar7 = ::std::operator<<(poVar7,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                              );
                    poVar7 = ::std::operator<<(poVar7,"[Crate]");
                    poVar7 = ::std::operator<<(poVar7,":");
                    poVar7 = ::std::operator<<(poVar7,"ReadFields");
                    poVar7 = ::std::operator<<(poVar7,"():");
                    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1664);
                    ::std::operator<<(poVar7," ");
                    poVar7 = ::std::operator<<((ostream *)local_950,
                                               "Failed to read value reps legnth at `FIELDS` section."
                                              );
                    ::std::operator<<(poVar7,"\n");
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,&local_970);
                    ::std::__cxx11::string::~string((string *)&local_970);
                    this_local._7_1_ = 0;
                    i._4_4_ = 1;
                    ::std::__cxx11::ostringstream::~ostringstream(local_950);
                  }
                }
              }
            }
          }
        }
        else {
          ::std::__cxx11::string::operator+=
                    ((string *)&this->_err,"Failed to read # of fields at `FIELDS` section.\n");
          this_local._7_1_ = 0;
        }
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to move to `FIELDS` section.\n");
        this_local._7_1_ = 0;
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadFields() {
  if ((_fields_index < 0) || (_fields_index >= int64_t(_toc.sections.size()))) {
    _err += "Invalid index for `FIELDS` section.\n";
    return false;
  }

  if ((_version[0] == 0) && (_version[1] < 4)) {
    _err += "Version must be 0.4.0 or later, but got " +
            std::to_string(_version[0]) + "." + std::to_string(_version[1]) +
            "." + std::to_string(_version[2]) + "\n";
    return false;
  }

  const crate::Section &s = _toc.sections[size_t(_fields_index)];

  if (s.size == 0) {
    // accepts Empty FIELDS size.
    return true;
  }

  if (!_sr->seek_set(uint64_t(s.start))) {
    _err += "Failed to move to `FIELDS` section.\n";
    return false;
  }

  uint64_t num_fields;
  if (!_sr->read8(&num_fields)) {
    _err += "Failed to read # of fields at `FIELDS` section.\n";
    return false;
  }

  DCOUT("num_fields = " << num_fields);

  if (num_fields == 0) {
    // Fields may be empty, so OK
    return true;
  }

  if (num_fields > _config.maxNumFields) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many fields in `FIELDS` section.");
  }

  if (sizeof(void *) == 4) {
    // 32bit
    if (num_fields > std::numeric_limits<int32_t>::max() / sizeof(uint32_t)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many fields in `FIELDS` section.");
    }
  }

  CHECK_MEMORY_USAGE(size_t(num_fields) * sizeof(Field));

  _fields.resize(static_cast<size_t>(num_fields));

  // indices
  {

    CHECK_MEMORY_USAGE(size_t(num_fields) * sizeof(uint32_t));

    std::vector<uint32_t> tmp;
    tmp.resize(size_t(num_fields));
    if (!ReadCompressedInts(tmp.data(), size_t(num_fields))) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read Field token_index array.");
    }

    for (size_t i = 0; i < num_fields; i++) {
      _fields[i].token_index.value = tmp[i];
    }

    REDUCE_MEMORY_USAGE(size_t(num_fields) * sizeof(uint32_t));

  }

  // Value reps(LZ4 compressed)
  {
    uint64_t reps_size; // compressed size
    if (!_sr->read8(&reps_size)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read value reps legnth at `FIELDS` section.");
    }

    if (reps_size > size_t(s.size)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid byte size of Value reps data.");
    }

    if (reps_size > _sr->size()) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Compressed Value reps size exceeds USDC data.");
    }

    CHECK_MEMORY_USAGE(size_t(reps_size));

    // TODO: Decompress from _sr directly.
    std::vector<char> comp_buffer(static_cast<size_t>(reps_size));

    if (reps_size !=
        _sr->read(size_t(reps_size), size_t(reps_size),
                  reinterpret_cast<uint8_t *>(comp_buffer.data()))) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read reps data at `FIELDS` section.");
    }

    // reps datasize = LZ4 compressed. uncompressed size = num_fields * 8 bytes
    size_t uncompressed_size = size_t(num_fields) * sizeof(uint64_t);
    CHECK_MEMORY_USAGE(uncompressed_size);

    std::vector<uint64_t> reps_data;
    reps_data.resize(static_cast<size_t>(num_fields));


    if (uncompressed_size != LZ4Compression::DecompressFromBuffer(
                                 comp_buffer.data(),
                                 reinterpret_cast<char *>(reps_data.data()),
                                 size_t(reps_size), uncompressed_size, &_err)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read Fields ValueRep data.");
    }

    for (size_t i = 0; i < num_fields; i++) {
      _fields[i].value_rep = crate::ValueRep(reps_data[i]);
    }

    REDUCE_MEMORY_USAGE(uncompressed_size);
    REDUCE_MEMORY_USAGE(size_t(reps_size)); // comp_buffer
  }

  DCOUT("num_fields = " << num_fields);
  for (size_t i = 0; i < num_fields; i++) {
    if (auto tokv = GetToken(_fields[i].token_index)) {
      DCOUT("field[" << i << "] name = " << tokv.value()
                     << ", value = " << _fields[i].value_rep.GetStringRepr());
    }
  }

  return true;
}